

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallSet.h
# Opt level: O2

VIterator __thiscall
llvm::SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::vfind
          (SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *this,uint *V)

{
  VIterator puVar1;
  VIterator puVar2;
  VIterator puVar3;
  ulong uVar4;
  long lVar5;
  
  puVar3 = (VIterator)
           (this->Vector).super_SmallVectorImpl<unsigned_int>.
           super_SmallVectorTemplateBase<unsigned_int,_true>.
           super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX;
  uVar4 = (ulong)(this->Vector).super_SmallVectorImpl<unsigned_int>.
                 super_SmallVectorTemplateBase<unsigned_int,_true>.
                 super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
  puVar1 = puVar3 + uVar4;
  lVar5 = uVar4 << 2;
  for (; (puVar2 = puVar1, lVar5 != 0 && (puVar2 = puVar3, *puVar3 != *V)); puVar3 = puVar3 + 1) {
    lVar5 = lVar5 + -4;
  }
  return puVar2;
}

Assistant:

VIterator vfind(const T &V) const {
    for (VIterator I = Vector.begin(), E = Vector.end(); I != E; ++I)
      if (*I == V)
        return I;
    return Vector.end();
  }